

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  pointer pcVar5;
  size_type sVar6;
  undefined8 uVar7;
  pointer pbVar8;
  bool bVar9;
  TargetType targetType;
  int iVar10;
  string *psVar11;
  long *plVar12;
  undefined4 extraout_var;
  char *pcVar13;
  cmGlobalNinjaGenerator *pcVar14;
  char *__s;
  char *__s_00;
  char *__s_01;
  size_t sVar15;
  string *psVar16;
  size_type *psVar17;
  ulong *puVar18;
  cmOutputConverter *pcVar19;
  string *i;
  pointer __rhs;
  string ppVar;
  string compilerLauncher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string cpplint_prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string run_iwyu;
  string cppcheck_prop;
  string responseFlag;
  string flags;
  string cmakeCmd;
  string launcher;
  cmNinjaRule rule;
  string tdi;
  string cldeps;
  RuleVariables vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  string local_5b0;
  string *local_590;
  undefined1 local_588 [32];
  cmMakefile *local_568;
  string local_560;
  string local_540;
  cmRulePlaceholderExpander *local_520;
  undefined1 local_518 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  int local_4c0;
  int local_4bc;
  long *local_4b8 [2];
  long local_4a8 [2];
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  long *local_458;
  long local_450;
  long local_448 [2];
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  undefined1 local_3f8 [32];
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  char *local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  char *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  char *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Alloc_hider local_358;
  char *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  _Alloc_hider local_318;
  char *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  bool local_2d8;
  string local_2d0;
  undefined1 local_2b0 [48];
  pointer local_280;
  char *local_260;
  char *local_250;
  char *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  char *local_1e8;
  char *pcStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  string local_1a0;
  string local_180;
  string local_160;
  RuleVariables local_140;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_140);
  psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_140.CMTargetName = (psVar11->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_140.CMTargetType = cmState::GetTargetTypeName(targetType);
  local_140.Language = (lang->_M_dataplus)._M_p;
  local_140.Source = "$in";
  local_140.Object = "$out";
  local_140.Defines = "$DEFINES";
  local_140.Includes = "$INCLUDES";
  local_140.TargetPDB = "$TARGET_PDB";
  local_140.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_140.ObjectDir = "$OBJECT_DIR";
  local_140.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_4bc = std::__cxx11::string::compare((char *)lang);
  local_4c0 = std::__cxx11::string::compare((char *)lang);
  local_568 = (this->super_cmCommonTargetGenerator).Makefile;
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"$FLAGS","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  local_478._M_string_length = 0;
  local_478.field_2._M_local_buf[0] = '\0';
  iVar10 = std::__cxx11::string::compare((char *)lang);
  local_590 = lang;
  if ((iVar10 != 0) && (bVar9 = ForceResponseFile(this), bVar9)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   "CMAKE_",lang);
    plVar12 = (long *)std::__cxx11::string::append(local_2b0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar17) {
      local_3f8._16_8_ = *psVar17;
      local_3f8._24_8_ = plVar12[3];
      local_3f8._0_8_ = local_3f8 + 0x10;
    }
    else {
      local_3f8._16_8_ = *psVar17;
      local_3f8._0_8_ = (size_type *)*plVar12;
    }
    local_3f8._8_8_ = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
    }
    cmMakefile::GetSafeDefinition
              ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_3f8);
    std::__cxx11::string::_M_assign((string *)&local_478);
    if (((char *)local_478._M_string_length == (char *)0x0) &&
       (iVar10 = std::__cxx11::string::compare((char *)local_590), iVar10 != 0)) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_478,0,(char *)local_478._M_string_length,0x605b0b);
    }
    lang = local_590;
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      lang = local_590;
    }
  }
  iVar10 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
             _vptr_cmLocalGenerator[5])();
  local_520 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar10);
  pcVar3 = this->LocalGenerator;
  GetTargetDependInfoPath((string *)local_2b0,this,lang);
  ConvertToNinjaPath((string *)local_3f8,this,(string *)local_2b0);
  cmOutputConverter::ConvertToOutputFormat
            (&local_2d0,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             (string *)local_3f8,SHELL);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3f8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != paVar2) {
    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
  }
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
  }
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = this->LocalGenerator;
  local_3f8._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"RULE_LAUNCH_COMPILE","");
  pcVar13 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,pcVar4,(string *)local_3f8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != paVar2) {
    operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
  }
  sVar6 = local_418._M_string_length;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
    strlen(pcVar13);
    std::__cxx11::string::_M_replace((ulong)&local_418,0,(char *)sVar6,(ulong)pcVar13);
    std::__cxx11::string::append((char *)&local_418);
  }
  pcVar3 = this->LocalGenerator;
  psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat
            (&local_438,
             &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar11,SHELL);
  if (local_4bc == 0) {
    LanguagePreprocessRule(&local_160,this,lang);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) {
      local_3f8._24_8_ = local_160.field_2._8_8_;
      local_3f8._0_8_ = paVar2;
    }
    else {
      local_3f8._0_8_ = local_160._M_dataplus._M_p;
    }
    local_3f8._17_7_ = local_160.field_2._M_allocated_capacity._1_7_;
    local_3f8[0x10] = local_160.field_2._M_local_buf[0];
    local_3d8._M_p = (pointer)&local_3c8;
    local_3f8._8_8_ = local_160._M_string_length;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    local_3d0 = 0;
    local_3c8._M_local_buf[0] = '\0';
    local_3b8._M_p = (pointer)&local_3a8;
    local_3b0 = (char *)0x0;
    local_3a8._M_local_buf[0] = '\0';
    local_398._M_p = (pointer)&local_388;
    local_390 = (char *)0x0;
    local_388._M_local_buf[0] = '\0';
    local_378._M_p = (pointer)&local_368;
    local_370 = (char *)0x0;
    local_368._M_local_buf[0] = '\0';
    local_358._M_p = (pointer)&local_348;
    local_350 = (char *)0x0;
    local_348._M_local_buf[0] = '\0';
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    local_338._M_string_length = 0;
    local_338.field_2._M_local_buf[0] = '\0';
    local_318._M_p = (pointer)&local_308;
    local_310 = (char *)0x0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8 = false;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_replace((ulong)&local_358,0,(char *)0x0,0x5e2ba2);
    std::__cxx11::string::_M_replace((ulong)&local_378,0,local_370,0x5c3b22);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_2b0);
    local_2b0._0_8_ = local_140.CMTargetName;
    local_2b0._8_8_ = local_140.CMTargetType;
    local_280 = local_140.Language;
    local_240 = "$out";
    local_250 = "$out";
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_p;
    local_260 = local_140.Source;
    local_140.Source = "$in";
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5b0,local_458,(long)local_458 + local_450);
    local_1e8 = local_140.Defines;
    pcStack_1e0 = local_140.Includes;
    local_140.Defines = "";
    if ((char *)local_478._M_string_length != (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_338,0,(char *)local_338._M_string_length,0x5c3ad5);
      std::__cxx11::string::_M_replace((ulong)&local_318,0,local_310,0x5c2669);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_5b0._M_dataplus._M_p);
      std::operator+(&local_5d8,&local_478,&local_338);
      std::__cxx11::string::operator=((string *)&local_5b0,(string *)&local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      local_1e8 = "";
      pcStack_1e0 = "";
    }
    local_228 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0._M_dataplus._M_p;
    local_588._0_8_ = (string *)0x0;
    local_588._8_8_ = (string *)0x0;
    local_588._16_8_ = (pointer)0x0;
    std::operator+(&local_5d8,"CMAKE_",lang);
    std::__cxx11::string::append((char *)&local_5d8);
    psVar11 = cmMakefile::GetRequiredDefinition
                        ((this->super_cmCommonTargetGenerator).Makefile,&local_5d8);
    cmSystemTools::ExpandListArgument
              (psVar11,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_588,false);
    paVar2 = &local_5d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_588._8_8_;
    if (local_588._0_8_ != local_588._8_8_) {
      psVar11 = (string *)local_588._0_8_;
      do {
        std::operator+(&local_5d8,&local_418,psVar11);
        std::__cxx11::string::operator=((string *)psVar11,(string *)&local_5d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        pcVar19 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          pcVar19 = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_520,pcVar19,psVar11,(RuleVariables *)local_2b0);
        psVar11 = psVar11 + 1;
      } while (psVar11 != (string *)uVar7);
    }
    local_5d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5d8,local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    std::__cxx11::string::append((char *)&local_5d8);
    std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)local_2d0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_5d8);
    std::__cxx11::string::_M_append((char *)&local_5d8,(ulong)(local_590->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_5d8);
    if (local_4c0 == 0) {
      std::__cxx11::string::append((char *)&local_5d8);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_588,
               &local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    local_540._M_string_length = 0;
    local_540.field_2._M_local_buf[0] = '\0';
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_5d8,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_588,&local_540,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_3d8,(string *)&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    lang = local_590;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,
                      CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                               local_540.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_398,0,local_390,0x5c3b5d);
    std::__cxx11::string::_M_append((char *)&local_398,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_398);
    std::__cxx11::string::_M_replace((ulong)&local_3b8,0,local_3b0,0x5c3b75);
    std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3b8);
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_3f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_588);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_3f8);
  }
  if (local_4c0 == 0) {
    LanguageDyndepRule(&local_180,this,lang);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == &local_180.field_2) {
      local_3f8._24_8_ = local_180.field_2._8_8_;
      local_3f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3f8 + 0x10);
    }
    else {
      local_3f8._0_8_ = local_180._M_dataplus._M_p;
    }
    local_3f8._17_7_ = local_180.field_2._M_allocated_capacity._1_7_;
    local_3f8[0x10] = local_180.field_2._M_local_buf[0];
    local_3d8._M_p = (pointer)&local_3c8;
    local_3f8._8_8_ = local_180._M_string_length;
    local_180._M_string_length = 0;
    local_180.field_2._M_local_buf[0] = '\0';
    local_3d0 = 0;
    local_3c8._M_local_buf[0] = '\0';
    local_3b8._M_p = (pointer)&local_3a8;
    local_3b0 = (char *)0x0;
    local_3a8._M_local_buf[0] = '\0';
    local_398._M_p = (pointer)&local_388;
    local_390 = (char *)0x0;
    local_388._M_local_buf[0] = '\0';
    local_378._M_p = (pointer)&local_368;
    local_370 = (char *)0x0;
    local_368._M_local_buf[0] = '\0';
    local_358._M_p = (pointer)&local_348;
    local_350 = (char *)0x0;
    local_348._M_local_buf[0] = '\0';
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    local_338._M_string_length = 0;
    local_338.field_2._M_local_buf[0] = '\0';
    local_318._M_p = (pointer)&local_308;
    local_310 = (char *)0x0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0 = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8 = false;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)0x0,0x5c3b92);
    std::__cxx11::string::_M_replace((ulong)&local_318,0,local_310,0x5c3d5d);
    local_5d8._M_dataplus._M_p = (pointer)0x0;
    local_5d8._M_string_length = 0;
    local_5d8.field_2._M_allocated_capacity = 0;
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b0,local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    std::__cxx11::string::append(local_2b0);
    std::__cxx11::string::_M_append(local_2b0,(ulong)local_2d0._M_dataplus._M_p);
    std::__cxx11::string::append(local_2b0);
    std::__cxx11::string::_M_append(local_2b0,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_2b0);
    std::__cxx11::string::append(local_2b0);
    std::__cxx11::string::_M_append(local_2b0,(ulong)local_338._M_dataplus._M_p);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_5d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
    }
    local_5b0._M_string_length = 0;
    local_5b0.field_2._M_allocated_capacity =
         local_5b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_2b0,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_5d8,&local_5b0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_5d8);
    std::__cxx11::string::_M_replace((ulong)&local_398,0,local_390,0x5c3bc5);
    lang = local_590;
    std::__cxx11::string::_M_append((char *)&local_398,(ulong)(local_590->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_398);
    std::__cxx11::string::_M_replace((ulong)&local_3b8,0,local_3b0,0x5a65c1);
    std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3b8);
    pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_3f8);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_3f8);
  }
  LanguageCompilerRule(&local_1a0,this,lang);
  paVar2 = &local_1a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p == paVar2) {
    local_3f8._24_8_ = local_1a0.field_2._8_8_;
    local_3f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3f8 + 0x10);
  }
  else {
    local_3f8._0_8_ = local_1a0._M_dataplus._M_p;
  }
  local_3d8._M_p = (pointer)&local_3c8;
  local_3f8._8_8_ = local_1a0._M_string_length;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_3d0 = 0;
  local_3c8._M_local_buf[0] = '\0';
  local_3b8._M_p = (pointer)&local_3a8;
  local_3b0 = (char *)0x0;
  local_3a8._M_local_buf[0] = '\0';
  local_398._M_p = (pointer)&local_388;
  local_390 = (char *)0x0;
  local_388._M_local_buf[0] = '\0';
  local_378._M_p = (pointer)&local_368;
  local_370 = (char *)0x0;
  local_368._M_local_buf[0] = '\0';
  local_358._M_p = (pointer)&local_348;
  local_350 = (char *)0x0;
  local_348._M_local_buf[0] = '\0';
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  local_338._M_string_length = 0;
  local_338.field_2._M_local_buf[0] = '\0';
  local_318._M_p = (pointer)&local_308;
  local_310 = (char *)0x0;
  local_308._M_local_buf[0] = '\0';
  local_2f8._M_p = (pointer)&local_2e8;
  local_2f0 = 0;
  local_2e8._M_local_buf[0] = '\0';
  local_2d8 = false;
  local_1a0._M_dataplus._M_p = (pointer)paVar2;
  if ((char *)local_478._M_string_length != (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)0x0,0x5c3ad5);
    std::__cxx11::string::_M_replace((ulong)&local_318,0,local_310,0x5c2669);
    std::__cxx11::string::append((char *)&local_318);
    std::__cxx11::string::append((char *)&local_318);
    std::__cxx11::string::append((char *)&local_318);
    std::__cxx11::string::append((char *)&local_318);
    std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_458);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   &local_478,&local_338);
    std::__cxx11::string::operator=((string *)&local_458,(string *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
    }
    local_140.Defines = "";
    local_140.Includes = "";
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_2b0._8_8_ = (char *)0x0;
  local_2b0[0x10] = '\0';
  if (local_4bc != 0) {
    bVar9 = NeedDepTypeMSVC(this,lang);
    if (bVar9) {
      std::__cxx11::string::_M_replace((ulong)&local_358,0,local_350,0x5c38fd);
      local_370 = (char *)0x0;
      *local_378._M_p = '\0';
      std::__cxx11::string::append((char *)&local_458);
    }
    else {
      std::operator+(&local_5b0,"CMAKE_NINJA_CMCLDEPS_",lang);
      bVar9 = cmMakefile::IsOn(local_568,&local_5b0);
      paVar2 = &local_5b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar9) {
        bVar9 = cmMakefile::GetIsSourceFileTryCompile(local_568);
        if (bVar9) goto LAB_0033173c;
        std::__cxx11::string::_M_replace((ulong)&local_358,0,local_350,0x5c3c25);
        std::__cxx11::string::_M_replace((ulong)&local_378,0,local_370,0x5c3b22);
        paVar1 = &local_5d8.field_2;
        local_5d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"CMAKE_C_COMPILER","");
        pcVar13 = cmMakefile::GetDefinition(local_568,&local_5d8);
        local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
        if (pcVar13 == (char *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_540,"CMAKE_CXX_COMPILER","");
          psVar11 = cmMakefile::GetSafeDefinition(local_568,&local_540);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_540,"CMAKE_C_COMPILER","");
          psVar11 = cmMakefile::GetSafeDefinition(local_568,&local_540);
        }
        pcVar5 = (psVar11->_M_dataplus)._M_p;
        local_5b0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5b0,pcVar5,pcVar5 + psVar11->_M_string_length);
        psVar11 = local_590;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_dataplus._M_p != &local_540.field_2) {
          operator_delete(local_540._M_dataplus._M_p,
                          CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                                   local_540.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace((ulong)local_2b0,0,(char *)local_2b0._8_8_,0x5cb2b0);
        psVar16 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::_M_append(local_2b0,(ulong)(psVar16->_M_dataplus)._M_p);
        std::operator+(&local_498,"\" ",psVar11);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_498);
        psVar11 = (string *)(plVar12 + 2);
        if ((string *)*plVar12 == psVar11) {
          local_518._16_8_ = (psVar11->_M_dataplus)._M_p;
          local_518._24_8_ = plVar12[3];
          local_518._0_8_ = (string *)(local_518 + 0x10);
        }
        else {
          local_518._16_8_ = (psVar11->_M_dataplus)._M_p;
          local_518._0_8_ = (string *)*plVar12;
        }
        local_518._8_8_ = plVar12[1];
        *plVar12 = (long)psVar11;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_518);
        psVar11 = (string *)(local_588 + 0x10);
        psVar16 = (string *)(plVar12 + 2);
        if ((string *)*plVar12 == psVar16) {
          local_588._16_8_ = (psVar16->_M_dataplus)._M_p;
          local_588._24_8_ = plVar12[3];
          local_588._0_8_ = psVar11;
        }
        else {
          local_588._16_8_ = (psVar16->_M_dataplus)._M_p;
          local_588._0_8_ = (string *)*plVar12;
        }
        local_588._8_8_ = plVar12[1];
        *plVar12 = (long)psVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_588);
        psVar17 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5d8.field_2._M_allocated_capacity = *psVar17;
          local_5d8.field_2._8_8_ = plVar12[3];
          local_5d8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_5d8.field_2._M_allocated_capacity = *psVar17;
          local_5d8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_5d8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append(local_2b0,(ulong)local_5d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_588._0_8_ != psVar11) {
          operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
        }
        if ((string *)local_518._0_8_ != (string *)(local_518 + 0x10)) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
        }
        lang = local_590;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        local_5d8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5d8,"CMAKE_CL_SHOWINCLUDES_PREFIX","");
        psVar16 = cmMakefile::GetSafeDefinition(local_568,&local_5d8);
        std::__cxx11::string::_M_append(local_2b0,(ulong)(psVar16->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_588,"\" \"",&local_5b0);
        plVar12 = (long *)std::__cxx11::string::append(local_588);
        psVar17 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_5d8.field_2._M_allocated_capacity = *psVar17;
          local_5d8.field_2._8_8_ = plVar12[3];
          local_5d8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_5d8.field_2._M_allocated_capacity = *psVar17;
          local_5d8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_5d8._M_string_length = plVar12[1];
        *plVar12 = (long)psVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append(local_2b0,(ulong)local_5d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_588._0_8_ != psVar11) {
          operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_0033173c;
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_358,0,local_350,0x5c3c25);
        std::__cxx11::string::_M_replace((ulong)&local_378,0,local_370,0x5c3b22);
        std::operator+(&local_5b0,"CMAKE_DEPFILE_FLAGS_",lang);
        psVar11 = cmMakefile::GetSafeDefinition(local_568,&local_5b0);
        pcVar5 = (psVar11->_M_dataplus)._M_p;
        local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5d8,pcVar5,pcVar5 + psVar11->_M_string_length);
        if (local_5d8._M_string_length != 0) {
          cmsys::SystemTools::ReplaceString(&local_5d8,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString(&local_5d8,"<OBJECT>","$out");
          paVar1 = &local_540.field_2;
          local_540._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_540,"CMAKE_C_COMPILER","");
          pcVar13 = cmMakefile::GetDefinition(local_568,&local_540);
          cmsys::SystemTools::ReplaceString(&local_5d8,"<CMAKE_C_COMPILER>",pcVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != paVar1) {
            operator_delete(local_540._M_dataplus._M_p,
                            CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                                     local_540.field_2._M_local_buf[0]) + 1);
          }
          std::operator+(&local_540," ",&local_5d8);
          std::__cxx11::string::_M_append((char *)&local_458,(ulong)local_540._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != paVar1) {
            operator_delete(local_540._M_dataplus._M_p,
                            CONCAT71(local_540.field_2._M_allocated_capacity._1_7_,
                                     local_540.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        lang = local_590;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0._M_dataplus._M_p == paVar2) goto LAB_0033173c;
      }
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0033173c:
  local_140.Flags = (char *)local_458;
  local_140.DependencyFile = local_378._M_p;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = std::__cxx11::string::compare((char *)lang);
  if (iVar10 == 0) {
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    local_5b0._M_string_length = 0;
    local_5b0.field_2._M_allocated_capacity =
         local_5b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    paVar2 = &local_5d8.field_2;
    local_5d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5d8,"CUDA_SEPARABLE_COMPILATION","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      pcVar13 = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    }
    else {
      pcVar4 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      local_5d8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5d8,"CUDA_PTX_COMPILATION","");
      bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
      if (bVar9) {
        pcVar13 = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
      }
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_5b0,0,(char *)local_5b0._M_string_length,(ulong)pcVar13);
    psVar11 = cmMakefile::GetRequiredDefinition(local_568,&local_5b0);
    cmSystemTools::ExpandListArgument(psVar11,&local_4d8,false);
  }
  else {
    std::operator+(&local_5d8,"CMAKE_",lang);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_5d8);
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    puVar18 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_5b0.field_2._M_allocated_capacity = *puVar18;
      local_5b0.field_2._8_8_ = plVar12[3];
    }
    else {
      local_5b0.field_2._M_allocated_capacity = *puVar18;
      local_5b0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_5b0._M_string_length = plVar12[1];
    *plVar12 = (long)puVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    psVar11 = cmMakefile::GetRequiredDefinition(local_568,&local_5b0);
    cmSystemTools::ExpandListArgument(psVar11,&local_4d8,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  psVar11 = local_590;
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0._M_string_length = 0;
  local_5b0.field_2._M_allocated_capacity =
       local_5b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((((iVar10 = std::__cxx11::string::compare((char *)local_590), iVar10 == 0 ||
        (iVar10 = std::__cxx11::string::compare((char *)psVar11), iVar10 == 0)) ||
       (iVar10 = std::__cxx11::string::compare((char *)psVar11), iVar10 == 0)) ||
      (iVar10 = std::__cxx11::string::compare((char *)psVar11), iVar10 == 0)))) {
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5d8,pcVar5,pcVar5 + psVar11->_M_string_length);
    std::__cxx11::string::append((char *)&local_5d8);
    pcVar13 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_5d8);
    sVar6 = local_5b0._M_string_length;
    if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
      strlen(pcVar13);
      std::__cxx11::string::_M_replace((ulong)&local_5b0,0,(char *)sVar6,(ulong)pcVar13);
    }
    psVar11 = local_590;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      psVar11 = local_590;
    }
  }
  if ((local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((iVar10 = std::__cxx11::string::compare((char *)psVar11), iVar10 == 0 ||
      (iVar10 = std::__cxx11::string::compare((char *)psVar11), iVar10 == 0)))) {
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5d8,pcVar5,pcVar5 + psVar11->_M_string_length);
    std::__cxx11::string::append((char *)&local_5d8);
    pcVar13 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_5d8);
    local_588._0_8_ = local_588 + 0x10;
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_588,pcVar5,pcVar5 + psVar11->_M_string_length);
    std::__cxx11::string::append(local_588);
    __s = cmGeneratorTarget::GetProperty
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_588);
    local_518._0_8_ = local_518 + 0x10;
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_518,pcVar5,pcVar5 + psVar11->_M_string_length);
    std::__cxx11::string::append(local_518);
    __s_00 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)local_518);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    pcVar5 = (psVar11->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_498,pcVar5,pcVar5 + psVar11->_M_string_length);
    std::__cxx11::string::append((char *)&local_498);
    __s_01 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_498);
    if (((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) ||
       ((((__s != (char *)0x0 && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0'))))
        || ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))))) {
      local_4b8[0] = local_4a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4b8,local_438._M_dataplus._M_p,
                 local_438._M_dataplus._M_p + local_438._M_string_length);
      std::__cxx11::string::append((char *)local_4b8);
      if ((char *)local_5b0._M_string_length != (char *)0x0) {
        std::__cxx11::string::append((char *)local_4b8);
        cmOutputConverter::EscapeForShell
                  (&local_560,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_5b0,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_560._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        local_5b0._M_string_length = 0;
        *local_5b0._M_dataplus._M_p = '\0';
      }
      if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
        std::__cxx11::string::append((char *)local_4b8);
        pcVar3 = this->LocalGenerator;
        local_4f8._M_allocated_capacity = (size_type)&local_4e8;
        sVar15 = strlen(pcVar13);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4f8,pcVar13,pcVar13 + sVar15);
        cmOutputConverter::EscapeForShell
                  (&local_560,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&local_4f8,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_560._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_allocated_capacity != &local_4e8) {
          operator_delete((void *)local_4f8._M_allocated_capacity,
                          local_4e8._M_allocated_capacity + 1);
        }
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)local_4b8);
        pcVar3 = this->LocalGenerator;
        local_4f8._M_allocated_capacity = (size_type)&local_4e8;
        sVar15 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,__s,__s + sVar15);
        cmOutputConverter::EscapeForShell
                  (&local_560,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&local_4f8,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_560._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_allocated_capacity != &local_4e8) {
          operator_delete((void *)local_4f8._M_allocated_capacity,
                          local_4e8._M_allocated_capacity + 1);
        }
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)local_4b8);
        pcVar3 = this->LocalGenerator;
        local_4f8._M_allocated_capacity = (size_type)&local_4e8;
        sVar15 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,__s_00,__s_00 + sVar15)
        ;
        cmOutputConverter::EscapeForShell
                  (&local_560,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&local_4f8,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_560._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_allocated_capacity != &local_4e8) {
          operator_delete((void *)local_4f8._M_allocated_capacity,
                          local_4e8._M_allocated_capacity + 1);
        }
      }
      if ((__s_01 != (char *)0x0) && (*__s_01 != '\0')) {
        std::__cxx11::string::append((char *)local_4b8);
        pcVar3 = this->LocalGenerator;
        local_4f8._M_allocated_capacity = (size_type)&local_4e8;
        sVar15 = strlen(__s_01);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,__s_01,__s_01 + sVar15)
        ;
        cmOutputConverter::EscapeForShell
                  (&local_560,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&local_4f8,false,false,false);
        std::__cxx11::string::_M_append((char *)local_4b8,(ulong)local_560._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_allocated_capacity != &local_4e8) {
          operator_delete((void *)local_4f8._M_allocated_capacity,
                          local_4e8._M_allocated_capacity + 1);
        }
      }
      if ((((__s != (char *)0x0) && (*__s != '\0')) ||
          ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))) ||
         ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))) {
        std::__cxx11::string::append((char *)local_4b8);
      }
      std::__cxx11::string::append((char *)local_4b8);
      std::__cxx11::string::replace
                ((ulong)local_4d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,(ulong)local_4b8[0])
      ;
      if (local_4b8[0] != local_4a8) {
        operator_delete(local_4b8[0],local_4a8[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_518._0_8_ != (string *)(local_518 + 0x10)) {
      operator_delete((void *)local_518._0_8_,(ulong)(local_518._16_8_ + 1));
    }
    if ((string *)local_588._0_8_ != (string *)(local_588 + 0x10)) {
      operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_4d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((char *)local_5b0._M_string_length != (char *)0x0)) {
    local_518._0_8_ = (string *)0x0;
    local_518._8_8_ = (string *)0x0;
    local_518._16_8_ = (pointer)0x0;
    cmSystemTools::ExpandListArgument
              (&local_5b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_518,true);
    if (local_518._0_8_ != local_518._8_8_) {
      cmOutputConverter::ConvertToOutputFormat
                (&local_5d8,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_518._0_8_,SHELL);
      std::__cxx11::string::operator=((string *)local_518._0_8_,(string *)&local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_518._8_8_;
      psVar11 = (string *)(local_518._0_8_ + 0x20);
      if (psVar11 != (string *)local_518._8_8_) {
        do {
          cmOutputConverter::EscapeForShell
                    (&local_5d8,
                     &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,psVar11,false,false,false);
          std::__cxx11::string::operator=((string *)psVar11,(string *)&local_5d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
            operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
          }
          psVar11 = psVar11 + 1;
        } while (psVar11 != (string *)uVar7);
      }
    }
    pbVar8 = local_4d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_588,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_518," ");
    plVar12 = (long *)std::__cxx11::string::append(local_588);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_5d8.field_2._M_allocated_capacity = *psVar17;
      local_5d8.field_2._8_8_ = plVar12[3];
      local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    }
    else {
      local_5d8.field_2._M_allocated_capacity = *psVar17;
      local_5d8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_5d8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::replace((ulong)pbVar8,0,(char *)0x0,(ulong)local_5d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    if ((string *)local_588._0_8_ != (string *)(local_588 + 0x10)) {
      operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_518);
  }
  if (local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::replace
              ((ulong)local_4d8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,local_2b0._0_8_);
  }
  pbVar8 = local_4d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __rhs = local_4d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+(&local_5d8,&local_418,__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      pcVar19 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar19 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables(local_520,pcVar19,__rhs,&local_140);
      __rhs = __rhs + 1;
    } while (__rhs != pbVar8);
  }
  local_588._8_8_ = (pointer)0x0;
  local_588._16_8_ = local_588._16_8_ & 0xffffffffffffff00;
  local_588._0_8_ = (pointer)(local_588 + 0x10);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_5d8,this->LocalGenerator,&local_4d8,(string *)local_588,(cmGeneratorTarget *)0x0
            );
  std::__cxx11::string::operator=((string *)&local_3d8,(string *)&local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_588._0_8_ != (pointer)(local_588 + 0x10)) {
    operator_delete((void *)local_588._0_8_,(ulong)(local_588._16_8_ + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&local_398,0,local_390,0x5c3d61);
  psVar11 = local_590;
  std::__cxx11::string::_M_append((char *)&local_398,(ulong)(local_590->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_398);
  std::__cxx11::string::_M_replace((ulong)&local_3b8,0,local_3b0,0x5c3b75);
  std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)(psVar11->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_3b8);
  pcVar14 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar14,(cmNinjaRule *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,CONCAT71(local_2b0._17_7_,local_2b0[0x10]) + 1);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,
                    CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                             local_418.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_520 != (cmRulePlaceholderExpander *)0x0) {
    std::default_delete<cmRulePlaceholderExpander>::operator()
              ((default_delete<cmRulePlaceholderExpander> *)&local_520,local_520);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,
                    CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                             local_478.field_2._M_local_buf[0]) + 1);
  }
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (explicitPP) {
    cmNinjaRule rule(this->LanguagePreprocessRule(lang));
    // Explicit preprocessing always uses a depfile.
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = rule.DepFile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    if (!responseFlag.empty()) {
      rule.RspFile = "$RSP_FILE";
      rule.RspContent = " ";
      rule.RspContent += ppVars.Defines;
      rule.RspContent += " ";
      rule.RspContent += ppVars.Includes;
      rule.RspContent += " ";
      rule.RspContent += ppFlags;
      ppFlags = responseFlag + rule.RspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    {
      // Lookup the explicit preprocessing rule.
      std::string ppVar = "CMAKE_" + lang;
      ppVar += "_PREPROCESS_SOURCE";
      cmSystemTools::ExpandListArgument(
        this->GetMakefile()->GetRequiredDefinition(ppVar), ppCmds);
    }

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    {
      std::string ccmd = cmakeCmd;
      ccmd += " -E cmake_ninja_depends --tdi=";
      ccmd += tdi;
      ccmd += " --lang=";
      ccmd += lang;
      ccmd += " --pp=$out --dep=$DEP_FILE";
      if (needDyndep) {
        ccmd += " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
      }
      ppCmds.emplace_back(std::move(ccmd));
    }
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    rule.Comment = "Rule for preprocessing ";
    rule.Comment += lang;
    rule.Comment += " files.";
    rule.Description = "Building ";
    rule.Description += lang;
    rule.Description += " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmakeCmd;
        ccmd += " -E cmake_ninja_dyndep --tdi=";
        ccmd += tdi;
        ccmd += " --lang=";
        ccmd += lang;
        ccmd += " --dd=$out ";
        ccmd += "@";
        ccmd += rule.RspFile;
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command = this->GetLocalGenerator()->BuildCommandLine(ddCmds);
    }
    rule.Comment = "Rule to generate ninja dyndep files for ";
    rule.Comment += lang;
    rule.Comment += ".";
    rule.Description = "Generating ";
    rule.Description += lang;
    rule.Description += " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent = " ";
    rule.RspContent += vars.Defines;
    rule.RspContent += " ";
    rule.RspContent += vars.Includes;
    rule.RspContent += " ";
    rule.RspContent += flags;
    flags = responseFlag + rule.RspFile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    rule.DepType = "msvc";
    rule.DepFile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    rule.DepType = "gcc";
    rule.DepFile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = cmakeCmd;
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    if (!args.empty()) {
      args[0] = this->LocalGenerator->ConvertToOutputFormat(
        args[0], cmOutputConverter::SHELL);
      for (std::string& i : cmMakeRange(args.begin() + 1, args.end())) {
        i = this->LocalGenerator->EscapeForShell(i);
      }
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command = this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  rule.Comment = "Rule for compiling ";
  rule.Comment += lang;
  rule.Comment += " files.";
  rule.Description = "Building ";
  rule.Description += lang;
  rule.Description += " object $out";
  this->GetGlobalGenerator()->AddRule(rule);
}